

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackComponentGroup.h
# Opt level: O0

void __thiscall cmCPackComponentGroup::~cmCPackComponentGroup(cmCPackComponentGroup *this)

{
  cmCPackComponentGroup *this_local;
  
  std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>::~vector
            (&this->Subgroups);
  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::~vector(&this->Components);
  std::__cxx11::string::~string((string *)&this->Description);
  std::__cxx11::string::~string((string *)&this->DisplayName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmCPackComponentGroup()
    : IsBold(false)
    , IsExpandedByDefault(false)
  {
  }